

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_OperatorPhase15(opm_t *chip)

{
  uint uVar1;
  ushort local_1a;
  ushort local_18;
  int16_t mod2;
  int16_t mod1;
  int16_t mod;
  uint32_t slot;
  opm_t *chip_local;
  
  uVar1 = chip->cycles + 0x12;
  local_18 = 0;
  local_1a = 0;
  if (chip->op_modtable[0] != '\0') {
    local_1a = chip->op_m1[uVar1 & 7][0];
  }
  if (chip->op_modtable[1] != '\0') {
    local_18 = chip->op_m1[uVar1 & 7][1];
  }
  if (chip->op_modtable[2] != '\0') {
    local_18 = local_18 | chip->op_c1[uVar1 & 7];
  }
  if (chip->op_modtable[3] != '\0') {
    local_1a = local_1a | chip->op_out[5];
  }
  if (chip->op_modtable[4] != '\0') {
    local_18 = local_18 | chip->op_out[5];
  }
  chip->op_mod[0] = (int16_t)((int)(short)local_18 + (int)(short)local_1a >> 1);
  if (chip->op_fbupdate != '\0') {
    chip->op_m1[uVar1 & 7][1] = chip->op_m1[uVar1 & 7][0];
    chip->op_m1[uVar1 & 7][0] = chip->op_out[5];
  }
  if (chip->op_c1update != '\0') {
    chip->op_c1[uVar1 & 7] = chip->op_out[5];
  }
  return;
}

Assistant:

static void OPM_OperatorPhase15(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 18) % 32;
    int16_t mod, mod1 = 0, mod2 = 0;
    if (chip->op_modtable[0])
    {
        mod2 |= chip->op_m1[slot % 8][0];
    }
    if (chip->op_modtable[1])
    {
        mod1 |= chip->op_m1[slot % 8][1];
    }
    if (chip->op_modtable[2])
    {
        mod1 |= chip->op_c1[slot % 8];
    }
    if (chip->op_modtable[3])
    {
        mod2 |= chip->op_out[5];
    }
    if (chip->op_modtable[4])
    {
        mod1 |= chip->op_out[5];
    }
    mod = (mod1 + mod2) >> 1;
    chip->op_mod[0] = mod;
    if (chip->op_fbupdate)
    {
        chip->op_m1[slot % 8][1] = chip->op_m1[slot % 8][0];
        chip->op_m1[slot % 8][0] = chip->op_out[5];
    }
    if (chip->op_c1update)
    {
        chip->op_c1[slot % 8] = chip->op_out[5];
    }
}